

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EntityType::Encode(EntityType *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  EntityType *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8EntityKind);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Domain);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Country);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Category);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8SubCategory);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Specific);
  KDataStream::operator<<(pKVar1,this->m_ui8Extra);
  return;
}

Assistant:

void EntityType::Encode( KDataStream & stream ) const
{
    stream << m_ui8EntityKind
           << m_ui8Domain
           << m_ui16Country
           << m_ui8Category
           << m_ui8SubCategory
           << m_ui8Specific
           << m_ui8Extra;
}